

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::peer_is_interesting(torrent *this,peer_connection *c)

{
  bool bVar1;
  uint uVar2;
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  *this_00;
  peer_connection *c_local;
  torrent *this_local;
  
  uVar2 = (*(c->super_bandwidth_socket)._vptr_bandwidth_socket[0x1b])();
  if ((uVar2 & 1) == 0) {
    peer_connection::send_interested(c);
    bVar1 = peer_connection::has_peer_choked(c);
    if (bVar1) {
      this_00 = peer_connection::allowed_fast(c);
      bVar1 = ::std::
              vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
              ::empty(this_00);
      if (bVar1) {
        return;
      }
    }
    bVar1 = request_a_block(this,c);
    if (bVar1) {
      inc_stats_counter(this,0x21,1);
    }
    peer_connection::send_block_requests(c);
  }
  return;
}

Assistant:

void torrent::peer_is_interesting(peer_connection& c)
	{
		INVARIANT_CHECK;

		// no peer should be interesting if we're finished
		TORRENT_ASSERT(!is_finished());

		if (c.in_handshake()) return;
		c.send_interested();
		if (c.has_peer_choked()
			&& c.allowed_fast().empty())
			return;

		if (request_a_block(*this, c))
			inc_stats_counter(counters::interesting_piece_picks);
		c.send_block_requests();
	}